

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void BuildPackedTable(HTreeGroup *htree_group)

{
  HuffmanCode hcode_00;
  int iVar1;
  uint uVar2;
  HuffmanCode32 *huff_00;
  long *in_RDI;
  HuffmanCode hcode;
  HuffmanCode32 *huff;
  uint32_t bits;
  uint32_t code;
  ushort uStack_1a;
  uint local_c;
  
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    huff_00 = (HuffmanCode32 *)(in_RDI + (ulong)local_c + 7);
    hcode_00 = *(HuffmanCode *)(*in_RDI + (ulong)local_c * 4);
    uStack_1a = hcode_00.value;
    if (uStack_1a < 0x100) {
      huff_00->bits = 0;
      huff_00->value = 0;
      iVar1 = AccumulateHCode(hcode_00,8,huff_00);
      uVar2 = local_c >> ((byte)iVar1 & 0x1f);
      iVar1 = AccumulateHCode(*(HuffmanCode *)(in_RDI[1] + (ulong)uVar2 * 4),0x10,huff_00);
      uVar2 = uVar2 >> ((byte)iVar1 & 0x1f);
      iVar1 = AccumulateHCode(*(HuffmanCode *)(in_RDI[2] + (ulong)uVar2 * 4),0,huff_00);
      AccumulateHCode(*(HuffmanCode *)(in_RDI[3] + (ulong)(uVar2 >> ((byte)iVar1 & 0x1f)) * 4),0x18,
                      huff_00);
    }
    else {
      huff_00->bits = ((uint)hcode_00 & 0xff) + 0x100;
      huff_00->value = (uint)uStack_1a;
    }
  }
  return;
}

Assistant:

static void BuildPackedTable(HTreeGroup* const htree_group) {
  uint32_t code;
  for (code = 0; code < HUFFMAN_PACKED_TABLE_SIZE; ++code) {
    uint32_t bits = code;
    HuffmanCode32* const huff = &htree_group->packed_table[bits];
    HuffmanCode hcode = htree_group->htrees[GREEN][bits];
    if (hcode.value >= NUM_LITERAL_CODES) {
      huff->bits = hcode.bits + BITS_SPECIAL_MARKER;
      huff->value = hcode.value;
    } else {
      huff->bits = 0;
      huff->value = 0;
      bits >>= AccumulateHCode(hcode, 8, huff);
      bits >>= AccumulateHCode(htree_group->htrees[RED][bits], 16, huff);
      bits >>= AccumulateHCode(htree_group->htrees[BLUE][bits], 0, huff);
      bits >>= AccumulateHCode(htree_group->htrees[ALPHA][bits], 24, huff);
      (void)bits;
    }
  }
}